

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyDataSPKM::AddCryptedKeyInner
          (LegacyDataSPKM *this,CPubKey *vchPubKey,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCryptedSecret)

{
  mapped_type *this_00;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock23;
  CKeyID local_9c;
  pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> local_88;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock23,&(this->super_FillableSigningProvider).cs_KeyStore,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x35d,false);
  if ((this->super_FillableSigningProvider).mapKeys._M_t._M_impl.super__Rb_tree_header._M_node_count
      != 0) {
    __assert_fail("mapKeys.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                  ,0x35e,
                  "bool wallet::LegacyDataSPKM::AddCryptedKeyInner(const CPubKey &, const std::vector<unsigned char> &)"
                 );
  }
  memcpy(&local_88,vchPubKey,0x41);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_88.second,vchCryptedSecret);
  CPubKey::GetID(&local_9c,vchPubKey);
  this_00 = std::
            map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
            ::operator[](&this->mapCryptedKeys,&local_9c);
  std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>::operator=
            (this_00,&local_88);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&local_88.second.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  FillableSigningProvider::ImplicitlyLearnRelatedKeyScripts
            (&this->super_FillableSigningProvider,vchPubKey);
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock23.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyDataSPKM::AddCryptedKeyInner(const CPubKey &vchPubKey, const std::vector<unsigned char> &vchCryptedSecret)
{
    LOCK(cs_KeyStore);
    assert(mapKeys.empty());

    mapCryptedKeys[vchPubKey.GetID()] = make_pair(vchPubKey, vchCryptedSecret);
    ImplicitlyLearnRelatedKeyScripts(vchPubKey);
    return true;
}